

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

bool testing::internal::HasGoogleTestFlagPrefix(char *str)

{
  bool bVar1;
  char *local_10;
  char *str_local;
  
  local_10 = str;
  bVar1 = SkipPrefix("--",&local_10);
  if ((((bVar1) || (bVar1 = SkipPrefix("-",&local_10), bVar1)) ||
      (bVar1 = SkipPrefix("/",&local_10), bVar1)) &&
     (bVar1 = SkipPrefix("gtest_internal_",&local_10), !bVar1)) {
    bVar1 = SkipPrefix("gtest_",&local_10);
    if (bVar1) {
      return true;
    }
    bVar1 = SkipPrefix("gtest-",&local_10);
    return bVar1;
  }
  return false;
}

Assistant:

static bool HasGoogleTestFlagPrefix(const char* str) {
			return (SkipPrefix("--", &str) ||
				SkipPrefix("-", &str) ||
				SkipPrefix("/", &str)) &&
				!SkipPrefix(GTEST_FLAG_PREFIX_ "internal_", &str) &&
				(SkipPrefix(GTEST_FLAG_PREFIX_, &str) ||
					SkipPrefix(GTEST_FLAG_PREFIX_DASH_, &str));
		}